

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void printPredictUsage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "usage: fasttext predict[-prob] <model> <test-data> [<k>] [<th>]\n\n");
  poVar1 = std::operator<<(poVar1,"  <model>      model filename\n");
  poVar1 = std::operator<<(poVar1,"  <test-data>  test data filename (if -, read from stdin)\n");
  poVar1 = std::operator<<(poVar1,"  <k>          (optional; 1 by default) predict top k labels\n");
  poVar1 = std::operator<<(poVar1,
                           "  <th>         (optional; 0.0 by default) probability threshold\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printPredictUsage() {
  std::cerr
      << "usage: fasttext predict[-prob] <model> <test-data> [<k>] [<th>]\n\n"
      << "  <model>      model filename\n"
      << "  <test-data>  test data filename (if -, read from stdin)\n"
      << "  <k>          (optional; 1 by default) predict top k labels\n"
      << "  <th>         (optional; 0.0 by default) probability threshold\n"
      << std::endl;
}